

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_read_cod(opj_j2k_t *j2k)

{
  opj_cio_t *cio;
  opj_image_t *poVar1;
  opj_codestream_info_t *poVar2;
  uint uVar3;
  OPJ_PROG_ORDER OVar4;
  int pos;
  int *piVar5;
  ulong uVar6;
  opj_tcp_t *poVar7;
  opj_codestream_info_t *cstr_info;
  long lVar8;
  ulong uVar9;
  
  cio = j2k->cio;
  if (j2k->state == 0x10) {
    poVar7 = j2k->cp->tcps + j2k->curtileno;
  }
  else {
    poVar7 = j2k->default_tcp;
  }
  poVar1 = j2k->image;
  cio_read(cio,2);
  uVar3 = cio_read(cio,1);
  poVar7->csty = uVar3;
  OVar4 = cio_read(cio,1);
  poVar7->prg = OVar4;
  uVar3 = cio_read(cio,2);
  poVar7->numlayers = uVar3;
  uVar3 = cio_read(cio,1);
  poVar7->mct = uVar3;
  pos = cio_tell(cio);
  lVar8 = 0;
  for (uVar9 = 0; uVar6 = (ulong)poVar1->numcomps, uVar9 < uVar6; uVar9 = uVar9 + 1) {
    *(uint *)((long)poVar7->tccps->stepsizes + lVar8 + -0x1c) = poVar7->csty & 1;
    cio_seek(cio,pos);
    j2k_read_cox(j2k,(int)uVar9);
    lVar8 = lVar8 + 0x438;
  }
  poVar2 = j2k->cstr_info;
  if (poVar2 != (opj_codestream_info_t *)0x0) {
    poVar2->prog = poVar7->prg;
    poVar2->numlayers = poVar7->numlayers;
    piVar5 = (int *)malloc(uVar6 * 4);
    poVar2->numdecompos = piVar5;
    lVar8 = 1;
    for (uVar9 = 0; uVar9 < uVar6; uVar9 = uVar9 + 1) {
      piVar5[uVar9] = *(int *)((long)poVar7->tccps->stepsizes + lVar8 * 4 + -0x1c) + -1;
      lVar8 = lVar8 + 0x10e;
    }
  }
  return;
}

Assistant:

static void j2k_read_cod(opj_j2k_t *j2k) {
	int len, i, pos;
	
	opj_cio_t *cio = j2k->cio;
	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = j2k->state == J2K_STATE_TPH ? &cp->tcps[j2k->curtileno] : j2k->default_tcp;
	opj_image_t *image = j2k->image;
	
	len = cio_read(cio, 2);				/* Lcod */
	tcp->csty = cio_read(cio, 1);		/* Scod */
	tcp->prg = (OPJ_PROG_ORDER)cio_read(cio, 1);		/* SGcod (A) */
	tcp->numlayers = cio_read(cio, 2);	/* SGcod (B) */
	tcp->mct = cio_read(cio, 1);		/* SGcod (C) */
	
	pos = cio_tell(cio);
	for (i = 0; i < image->numcomps; i++) {
		tcp->tccps[i].csty = tcp->csty & J2K_CP_CSTY_PRT;
		cio_seek(cio, pos);
		j2k_read_cox(j2k, i);
	}

	/* Index */
	if (j2k->cstr_info) {
		opj_codestream_info_t *cstr_info = j2k->cstr_info;
		cstr_info->prog = tcp->prg;
		cstr_info->numlayers = tcp->numlayers;
		cstr_info->numdecompos = (int*) opj_malloc(image->numcomps * sizeof(int));
		for (i = 0; i < image->numcomps; i++) {
			cstr_info->numdecompos[i] = tcp->tccps[i].numresolutions - 1;
		}
	}
}